

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O2

void * fe_load_effect(fe_state *s,fe_effect *effect)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  fe_node **ppfVar6;
  fe_node *pfVar7;
  fe_node *src;
  char *pcVar8;
  int i;
  uint uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  fe_state *__s1;
  byte bVar13;
  ulong uVar14;
  float fVar15;
  
  effect->text[0] = '\0';
  effect->path_back[0] = '\0';
  effect->path_font[0] = '\0';
  effect->distance = 1.0;
  effect->px = -999;
  effect->py = -999;
  pcVar12 = "#";
  __s1 = s;
  read_fixed(s,"#");
  if ((s->error != true) && (__s1 = s, read_token(s), s->error != true)) {
    pcVar12 = s->token;
    for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
      effect->id[lVar10] = pcVar12[lVar10];
    }
    pcVar12 = "size:";
    __s1 = s;
    read_fixed(s,"size:");
    if (s->error != true) {
      __s1 = s;
      iVar2 = read_int(s);
      effect->size = iVar2;
      if (s->error == false) {
LAB_001126d7:
        if (*s->data != '@') {
          __s1 = s;
          read_token(s);
          bVar13 = s->error;
          if ((bool)bVar13 == true) goto LAB_00112a12;
          __s1 = (fe_state *)s->token;
          pcVar12 = "distance";
          iVar2 = strcmp((char *)__s1,"distance");
          if (iVar2 == 0) {
            __s1 = s;
            fVar15 = read_float(s);
            effect->distance = fVar15;
          }
          else {
            pcVar12 = "pos";
            iVar2 = strcmp((char *)__s1,"pos");
            if (iVar2 != 0) {
              iVar2 = strcmp((char *)__s1,"font");
              pcVar8 = (char *)0x0;
              if (iVar2 == 0) {
                pcVar8 = effect->path_font;
              }
              iVar3 = strcmp((char *)__s1,"back");
              if (iVar3 == 0) {
                pcVar8 = effect->path_back;
              }
              pcVar12 = "text";
              iVar4 = strcmp((char *)__s1,"text");
              lVar10 = (ulong)(iVar3 == 0 || iVar2 == 0) << 8;
              if (iVar4 == 0) {
                pcVar8 = effect->text;
                lVar10 = 0x20;
              }
              pcVar5 = s->data;
              s->token = pcVar5;
              iVar2 = s->size;
              while (0 < iVar2) {
                cVar1 = *pcVar5;
                if ((cVar1 == '\0') || (cVar1 == '\n')) {
LAB_0011282f:
                  *pcVar5 = '\0';
                  s->data = s->data + 1;
                  s->size = s->size + -1;
                  bVar13 = s->error;
                  break;
                }
                if (cVar1 == '\r') {
                  *pcVar5 = '\0';
                  if (0 < s->size) {
                    pcVar5 = s->data + 1;
                    s->data = pcVar5;
                    s->size = s->size + -1;
                    goto LAB_0011282f;
                  }
                  goto LAB_00112a17;
                }
                pcVar5 = pcVar5 + 1;
                s->data = pcVar5;
                iVar2 = iVar2 + -1;
                s->size = iVar2;
              }
              if ((bVar13 & 1) != 0) goto LAB_00112a12;
              pcVar5 = s->token;
              for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
                pcVar8[lVar11] = pcVar5[lVar11];
              }
              goto LAB_001126d7;
            }
            __s1 = s;
            iVar2 = read_int(s);
            effect->px = (short)iVar2;
            if (s->error == true) goto LAB_00112a12;
            __s1 = s;
            iVar2 = read_int(s);
            effect->py = (short)iVar2;
          }
          if (s->error == true) goto LAB_00112a12;
          goto LAB_001126d7;
        }
        pcVar12 = "@nodes";
        __s1 = s;
        read_fixed(s,"@nodes");
        if ((s->error == true) || (__s1 = s, next_line(s), s->error == true)) goto LAB_00112a12;
        pcVar12 = (char *)0x0;
        iVar2 = s->size;
        if (s->size < 1) {
          iVar2 = 0;
        }
        uVar9 = 0;
        for (; (iVar2 != (int)pcVar12 &&
               (uVar9 = uVar9 + (s->data[(long)pcVar12] == '*'), s->data[(long)pcVar12] != '@'));
            pcVar12 = (char *)((long)&((fe_node *)pcVar12)->id + 1)) {
        }
        effect->num = uVar9;
        ppfVar6 = (fe_node **)_fe_alloc((long)(int)uVar9 * 8);
        effect->nodes = ppfVar6;
        for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
          __s1 = s;
          pfVar7 = fe_load_node(s);
          pfVar7->effect = effect;
          pfVar7->index = (int)uVar14;
          effect->nodes[uVar14] = pfVar7;
          if (s->error == true) goto LAB_00112a12;
          if (pfVar7->type == 0x32) {
            effect->out_node = pfVar7;
          }
        }
        pcVar12 = "@edges";
        __s1 = s;
        read_fixed(s,"@edges");
        if ((s->error == false) && (__s1 = s, next_line(s), s->error != true)) {
          pfVar7 = *effect->nodes;
          src = pfVar7;
          while( true ) {
            if (*s->data != '*') {
              return (void *)0x0;
            }
            s->data = s->data + 1;
            s->size = s->size + -1;
            __s1 = s;
            read_token(s);
            if (s->error == true) break;
            iVar2 = atoi(s->token);
            __s1 = s;
            read_token(s);
            if (s->error == true) break;
            iVar3 = atoi(s->token);
            __s1 = s;
            read_token(s);
            if (s->error == true) break;
            iVar4 = atoi(s->token);
            if (src->id != iVar2) {
              src = fe_effect_find_node(effect,iVar2);
            }
            if (pfVar7->id != iVar3) {
              pfVar7 = fe_effect_find_node(effect,iVar3);
            }
            pcVar12 = (char *)pfVar7;
            _fe_node_connect(src,pfVar7,iVar4);
          }
        }
      }
    }
  }
LAB_00112a12:
  error();
LAB_00112a17:
  s->error = true;
  error();
  __s1->token = __s1->data;
  iVar2 = __s1->size;
  pcVar8 = __s1->data;
  while( true ) {
    pcVar5 = pcVar8 + 1;
    cVar1 = (char)((fe_node *)pcVar12)->id;
    if (cVar1 == '\0') {
      return pcVar5;
    }
    if ((iVar2 < 1) || (*pcVar8 != cVar1)) break;
    __s1->data = pcVar5;
    iVar2 = iVar2 + -1;
    __s1->size = iVar2;
    pcVar12 = (char *)((long)&((fe_node *)pcVar12)->id + 1);
    pcVar8 = pcVar5;
  }
  __s1->error = true;
  return pcVar5;
}

Assistant:

void* fe_load_effect(fe_state& s, fe_effect* effect)
{
    effect->text[0] = 0;
    effect->path_back[0] = 0;
    effect->path_font[0] = 0;
    effect->distance = 1.0f;
	effect->px = -999;
	effect->py = -999;

    read_fixed(s, "#");
    CHECK_ERR();

    read_token(s);
    CHECK_ERR();
    safe_strcpy(effect->id, s.token);

    read_fixed(s, "size:");
    CHECK_ERR();

    effect->size = READ_INT(s);


    while (s.data[0] != '@')
    {
        read_token(s);
        CHECK_ERR();

        if (!strcmp(s.token, "distance"))
        {
            effect->distance = READ_FLOAT(s);
            continue;
        }


		if (!strcmp(s.token, "pos"))
		{
			effect->px = READ_INT(s);
			effect->py = READ_INT(s);
			continue;
		}

        char *param = 0;
        int len = 0;
        if (!strcmp(s.token, "font"))
        {
            len = sizeof(effect->path_font);
            param = effect->path_font;
        }
        if (!strcmp(s.token, "back"))
        {
            len = sizeof(effect->path_back);
            param = effect->path_back;
        }
        if (!strcmp(s.token, "text"))
        {
            len = sizeof(effect->text);
            param = effect->text;
        }

        

        read_token_end_line(s);
        CHECK_ERR();
        safe_strcpy(param, len, s.token);
    }
    
    read_fixed(s, "@nodes");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();

    int num = 0;
    const char* p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '@')
            break;
        ++p;
    }

    effect->num = num;
    effect->nodes = (fe_node**)_fe_alloc(sizeof(fe_node*) * num);

    for (int i = 0; i < num; ++i)
    {
        fe_node *node = fe_load_node(s);
        node->effect = effect;
        node->index = i;

        effect->nodes[i] = node;
        CHECK_ERR();      


        if (node->type == fe_node_type_out)
            effect->out_node = node;
    }

    read_fixed(s, "@edges");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();


    num = 0;
    p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '#')
            break;
        ++p;
    }


    fe_node* srcLast = effect->nodes[0];
    fe_node* destLast = effect->nodes[0];
    while (*s.data == '*')
    {
        s.data++;
        s.size--;

        read_token(s);
        CHECK_ERR();

        int sn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dp = atoi(s.token);

        if (srcLast->id != sn)
            srcLast = fe_effect_find_node(effect, sn);

        if (destLast->id != dn)
            destLast = fe_effect_find_node(effect, dn);

        _fe_node_connect(srcLast, destLast, dp);
    }



    return 0;
}